

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void __thiscall
bk_lib::pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>>::
insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::ValueSet>>
          (pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>> *this,iterator pos,uint n,
          Fill<Clasp::ValueSet> *pred)

{
  void *pvVar1;
  uint uVar2;
  void *__dest;
  uint uVar3;
  ulong __n;
  ValueSet *last;
  
  uVar3 = *(uint *)(this + 8) + n;
  if (*(uint *)(this + 0xc) < uVar3) {
    uVar2 = 2 << ((byte)uVar3 & 0x1f);
    if (3 < uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = *(uint *)(this + 0xc) * 3 >> 1;
    if (uVar3 < uVar2) {
      uVar3 = uVar2;
    }
    __dest = operator_new((ulong)uVar3);
    pvVar1 = *(void **)this;
    if (pvVar1 == (void *)0x0) {
      __n = (ulong)pos & 0xffffffff;
    }
    else {
      __n = (ulong)(uint)((int)pos - (int)pvVar1);
      memcpy(__dest,pvVar1,__n);
    }
    last = (ValueSet *)((long)__dest + __n) + n;
    detail::fill<Clasp::ValueSet>((ValueSet *)((long)__dest + __n),last,pred->val_);
    pvVar1 = *(void **)this;
    if (pos != (iterator)0x0) {
      memcpy(last,pos,(long)pvVar1 + ((ulong)*(uint *)(this + 8) - (long)pos));
    }
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    *(void **)this = __dest;
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
    *(uint *)(this + 0xc) = uVar3;
  }
  else {
    if (pos != (iterator)0x0) {
      memmove(pos + n,pos,((ulong)*(uint *)(this + 8) + *(long *)this) - (long)pos);
    }
    detail::fill<Clasp::ValueSet>(pos,pos + n,pred->val_);
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}